

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::WriteArray(ON_BinaryArchive *this,ON_SimpleArray<ON_Xform> *a)

{
  ON_Xform *x;
  bool local_31;
  int local_24;
  bool local_1d;
  int i;
  bool rc;
  int count;
  ON_SimpleArray<ON_Xform> *a_local;
  ON_BinaryArchive *this_local;
  
  i = ON_SimpleArray<ON_Xform>::Count(a);
  if (i < 0) {
    i = 0;
  }
  local_1d = WriteInt(this,i);
  if ((local_1d) && (0 < i)) {
    local_24 = 0;
    while( true ) {
      local_31 = false;
      if (local_24 < i) {
        local_31 = local_1d;
      }
      if (local_31 == false) break;
      x = ON_SimpleArray<ON_Xform>::operator[](a,local_24);
      local_1d = WriteXform(this,x);
      local_24 = local_24 + 1;
    }
  }
  return local_1d;
}

Assistant:

bool
ON_BinaryArchive::WriteArray( const ON_SimpleArray<ON_Xform>& a )
{
  int count = a.Count();
  if ( count < 0 )
    count = 0;
  bool rc = WriteInt( count );
  if ( rc && count > 0 ) 
  {
    int i;
    for ( i = 0; i < count && rc; i++ )
      rc = WriteXform(a[i]);
  }
  return rc;
}